

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void test_samplers(void)

{
  float y;
  float x;
  Sampler s;
  float local_90;
  float local_8c;
  Sampler local_88;
  
  create_samplers(&local_88,1);
  sample_unit_square(&local_88,&local_8c,&local_90,(float *)0x0);
  printf("%f %f\n",(double)local_8c,(double)local_90);
  sample_unit_square(&local_88,&local_8c,&local_90,(float *)0x0);
  printf("%f %f\n",(double)local_8c,(double)local_90);
  return;
}

Assistant:

void test_samplers() {
    Sampler s;
    create_samplers(&s, 1);
    for (int i = 0; i < 2 * STRATIFIED_RESOLUTION * STRATIFIED_RESOLUTION; i++) {
        float x, y;
        sample_unit_square(&s, &x, &y, NULL);
        printf("%f %f\n", x, y);
    }
}